

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O2

void __thiscall
tchecker::details::statement_typechecker_t::visit
          (statement_typechecker_t *this,local_var_statement_t *stmt)

{
  integer_variables_t *this_00;
  element_type *peVar1;
  long lVar2;
  integer_variables_t *piVar3;
  clock_variables_t *pcVar4;
  expression_t *expr;
  element_type *peVar5;
  bool bVar6;
  statement_type_t stmt_type;
  shared_ptr<const_tchecker::typed_var_expression_t> variable;
  __shared_ptr<tchecker::typed_local_var_statement_t,_(__gnu_cxx::_Lock_policy)2> local_c0;
  element_type *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_a0;
  local_var_statement_t *local_98;
  string name;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_70;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  
  std::__cxx11::string::string
            ((string *)&name,
             (string *)
             &((stmt->_variable).
               super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name);
  this_00 = &this->_localvars;
  bVar6 = variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::is_variable((variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this_00,&name);
  if (bVar6) {
    stmt_type = STMT_TYPE_BAD;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&variable,
                   "local variable already exists: ",&name);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&this->_error,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&variable);
  }
  else {
    bVar6 = variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::is_variable((variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this->_intvars,&name);
    if (!bVar6) {
      stmt_type = STMT_TYPE_LOCAL_INT;
      integer_variables_t::declare(this_00,&name,1,-0x80000000,0x7fffffff,0);
      goto LAB_0014c376;
    }
    stmt_type = STMT_TYPE_BAD;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&variable,
                   "local variable already exists: ",&name);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&this->_error,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&variable);
  }
  std::__cxx11::string::~string((string *)&variable);
LAB_0014c376:
  peVar1 = (stmt->_variable).
           super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar2 = *(long *)(*(long *)peVar1 + -0x38);
  piVar3 = this->_intvars;
  pcVar4 = this->_clocks;
  local_a0 = &this->_error;
  local_98 = stmt;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_50,local_a0);
  typecheck((tchecker *)&local_b0,(expression_t *)((long)&peVar1->field_0x0 + lVar2),this_00,piVar3,
            pcVar4,&local_50);
  std::dynamic_pointer_cast<tchecker::typed_var_expression_t_const,tchecker::typed_expression_t>
            ((shared_ptr<tchecker::typed_expression_t> *)&variable);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  expr = (local_98->_initial_value).
         super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  piVar3 = this->_intvars;
  pcVar4 = this->_clocks;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_70,local_a0);
  typecheck((tchecker *)&local_c0,expr,this_00,piVar3,pcVar4,&local_70);
  peVar5 = local_c0._M_ptr;
  local_b0 = local_c0._M_ptr;
  local_a8._M_pi = local_c0._M_refcount._M_pi;
  local_c0._M_ptr = (element_type *)0x0;
  local_c0._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  bVar6 = integer_valued((peVar5->super_typed_statement_t)._type);
  if (!bVar6) {
    stmt_type = STMT_TYPE_BAD;
  }
  std::
  make_shared<tchecker::typed_local_var_statement_t,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_var_expression_t_const>&,std::shared_ptr<tchecker::typed_expression_t_const>&>
            ((statement_type_t *)&local_c0,
             (shared_ptr<const_tchecker::typed_var_expression_t> *)&stmt_type,
             (shared_ptr<const_tchecker::typed_expression_t> *)&variable);
  std::__shared_ptr<tchecker::typed_statement_t,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<tchecker::typed_statement_t,(__gnu_cxx::_Lock_policy)2> *)
             &this->_typed_stmt,&local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&variable.
              super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

virtual void visit(tchecker::local_var_statement_t const & stmt)
  {
    enum tchecker::statement_type_t stmt_type;

    std::string name = stmt.variable().name();
    if (_localvars.is_variable(name)) {
      stmt_type = tchecker::STMT_TYPE_BAD;
      _error("local variable already exists: " + name);
    }
    else if (_intvars.is_variable(name)) {
      stmt_type = tchecker::STMT_TYPE_BAD;
      _error("local variable already exists: " + name);
    }
    else {
      stmt_type = tchecker::STMT_TYPE_LOCAL_INT;
      _localvars.declare(name, 1, tchecker::int_minval, tchecker::int_maxval, 0);
    }

    auto variable = std::dynamic_pointer_cast<tchecker::typed_var_expression_t const>(
        tchecker::typecheck(stmt.variable(), _localvars, _intvars, _clocks, _error));

    std::shared_ptr<tchecker::typed_expression_t const> init{
        tchecker::typecheck(stmt.initial_value(), _localvars, _intvars, _clocks, _error)};

    if (!tchecker::integer_valued(init->type()))
      stmt_type = tchecker::STMT_TYPE_BAD;

    _typed_stmt = std::make_shared<tchecker::typed_local_var_statement_t>(stmt_type, variable, init);
  }